

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.h
# Opt level: O3

void __thiscall level_info_t::~level_info_t(level_info_t *this)

{
  acsdefered_t *paVar1;
  acsdefered_t *paVar2;
  
  if (this->snapshot != (FCompressedMemFile *)0x0) {
    (*(this->snapshot->super_FCompressedFile).super_FFile._vptr_FFile[1])();
  }
  this->snapshot = (FCompressedMemFile *)0x0;
  paVar2 = this->defered;
  while (paVar2 != (acsdefered_t *)0x0) {
    paVar1 = paVar2->next;
    operator_delete(paVar2,0x20);
    paVar2 = paVar1;
  }
  this->defered = (acsdefered_t *)0x0;
  TArray<FName,_FName>::~TArray(&this->PrecacheClasses);
  TArray<FString,_FString>::~TArray(&this->PrecacheTextures);
  TArray<FSoundID,_FSoundID>::~TArray(&this->PrecacheSounds);
  TArray<FSpecialAction,_FSpecialAction>::~TArray(&this->specialactions);
  TMap<int,_FName,_THashTraits<int>,_TValueTraits<FName>_>::~TMap(&this->MusicMap);
  TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>::
  ClearNodeVector(&this->optdata);
  FString::~FString(&this->SndSeq);
  FString::~FString(&this->SoundInfo);
  FString::~FString(&this->InterMusic);
  FString::~FString(&this->ExitPic);
  FString::~FString(&this->EnterPic);
  FString::~FString(&this->RedirectMapName);
  FString::~FString(&this->Translator);
  FString::~FString(&this->LevelName);
  FString::~FString(&this->Music);
  FString::~FString(&this->MapBackground);
  FString::~FString(&this->BorderTexture);
  FString::~FString(&this->F1Pic);
  FString::~FString(&this->FadeTable);
  FString::~FString(&this->SkyPic2);
  FString::~FString(&this->SkyPic1);
  FString::~FString(&this->PName);
  FString::~FString(&this->NextSecretMap);
  FString::~FString(&this->NextMap);
  FString::~FString(&this->MapName);
  return;
}

Assistant:

~level_info_t()
	{
		ClearSnapshot(); 
		ClearDefered();
	}